

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blech32.c
# Opt level: O0

_Bool check_confidential_addr_from_addr_segwit_pubkey(void)

{
  char *__s2;
  char *__s1;
  int iVar1;
  size_t sVar2;
  _Bool is_success;
  char *pcStack_50;
  int ret;
  char *blech32;
  uchar pub_key [33];
  size_t local_18;
  size_t written;
  
  local_18 = 0;
  pcStack_50 = (char *)0x0;
  iVar1 = wally_hex_to_bytes(elements_confidential_key,(uchar *)&blech32,0x21,&local_18);
  if (iVar1 == 0) {
    if (local_18 == 0x21) {
      iVar1 = wally_confidential_addr_from_addr_segwit
                        (elements_bech32,"ert","el",(uchar *)&blech32,0x21,&stack0xffffffffffffffb0)
      ;
      __s1 = pcStack_50;
      __s2 = elements_blech32;
      if (iVar1 == 0) {
        sVar2 = strlen(elements_blech32);
        iVar1 = strncmp(__s1,__s2,sVar2 + 1);
        wally_free_string(pcStack_50);
        written._7_1_ = iVar1 == 0;
      }
      else {
        written._7_1_ = false;
      }
    }
    else {
      written._7_1_ = false;
    }
  }
  else {
    written._7_1_ = false;
  }
  return written._7_1_;
}

Assistant:

static bool check_confidential_addr_from_addr_segwit_pubkey(void)
{
    size_t written = 0;
    unsigned char pub_key[EC_PUBLIC_KEY_LEN];
    char *blech32 = NULL;
    int ret;
    bool is_success = false;

    ret = wally_hex_to_bytes(elements_confidential_key,
                             pub_key, EC_PUBLIC_KEY_LEN, &written);
    if (ret != WALLY_OK)
        return false;

    if (written != EC_PUBLIC_KEY_LEN)
        return false;

    ret = wally_confidential_addr_from_addr_segwit(elements_bech32,
                                                   "ert", "el", pub_key, EC_PUBLIC_KEY_LEN, &blech32);
    if (ret != WALLY_OK)
        return false;

    if (strncmp(blech32, elements_blech32, strlen(elements_blech32) + 1) == 0)
        is_success = true;

    wally_free_string(blech32);
    return is_success;
}